

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O2

void prngCOMBOStepR(void *buf,size_t count,void *state)

{
  long *plVar1;
  ulong count_00;
  long lVar2;
  
  plVar1 = (long *)((long)state + 0x10);
  count_00 = *(ulong *)((long)state + 0x10);
  if (count_00 != 0) {
    if (count <= count_00) {
      memCopy(buf,(void *)((long)plVar1 - count_00),count);
      lVar2 = *plVar1;
      goto LAB_0011a174;
    }
    memCopy(buf,(void *)((long)plVar1 - count_00),count_00);
    count = count - *plVar1;
    buf = (void *)((long)buf + *plVar1);
    *plVar1 = 0;
  }
  lVar2 = 4;
  for (; 3 < count; count = count - 4) {
    prngCOMBOStep((prng_combo_st *)state);
    memCopy(buf,(void *)((long)state + 0xc),4);
    buf = (void *)((long)buf + 4);
  }
  if (count == 0) {
    return;
  }
  prngCOMBOStep((prng_combo_st *)state);
  memCopy(buf,(void *)((long)state + 0xc),count);
LAB_0011a174:
  *plVar1 = lVar2 - count;
  return;
}

Assistant:

void prngCOMBOStepR(void* buf, size_t count, void* state)
{
	prng_combo_st* s = (prng_combo_st*)state;
	ASSERT(memIsValid(buf, count));
	ASSERT(memIsValid(s, sizeof(*s)));
	// есть резерв?
	if (s->reserved)
	{
		if (s->reserved >= count)
		{
			memCopy(buf, s->r.block + 4 - s->reserved, count);
			s->reserved -= count;
			return;
		}
		memCopy(buf, s->r.block + 4 - s->reserved, s->reserved);
		count -= s->reserved;
		buf = (octet*)buf + s->reserved;
		s->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 4)
	{
		prngCOMBOStep(s);
		memCopy(buf, s->r.block, 4);
		buf = (octet*)buf + 4;
		count -= 4;
	}
	// неполный блок?
	if (count)
	{
		prngCOMBOStep(s);
		memCopy(buf, s->r.block, count);
		s->reserved = 4 - count;
	}
}